

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

void Abc_SuppReadMinTest(char *pFileName)

{
  abctime aVar1;
  Vec_Wrd_t *local_30;
  Vec_Wrd_t *vCubes;
  Vec_Wrd_t *vPairs;
  int nVarsMin;
  int nVars;
  abctime clk;
  char *pFileName_local;
  
  clk = (abctime)pFileName;
  _nVarsMin = Abc_Clock();
  local_30 = Abc_SuppReadMin((char *)clk,(int *)((long)&vPairs + 4));
  if (local_30 != (Vec_Wrd_t *)0x0) {
    vCubes = Abc_SuppDiffMatrix(local_30);
    Vec_WrdFreeP(&local_30);
    _nVarsMin = Abc_Clock();
    vPairs._0_4_ = Abc_SuppSolve(vCubes,vPairs._4_4_);
    printf("Solution with %d variables found.  ",(ulong)(uint)vPairs);
    aVar1 = Abc_Clock();
    Abc_PrintTime(1,"Covering time",aVar1 - _nVarsMin);
    Vec_WrdFreeP(&vCubes);
  }
  return;
}

Assistant:

void Abc_SuppReadMinTest( char * pFileName )
{
//    int fVerbose = 0;
    abctime clk = Abc_Clock();
//    word Matrix[64];
    int nVars, nVarsMin;
    Vec_Wrd_t * vPairs, * vCubes;
    vCubes = Abc_SuppReadMin( pFileName, &nVars );
    if ( vCubes == NULL )
        return;
    vPairs = Abc_SuppDiffMatrix( vCubes );
    Vec_WrdFreeP( &vCubes );
    // solve the problem
    clk = Abc_Clock();
//    nVarsMin = Abc_SuppMinimize( Matrix, vPairs, nVars, fVerbose );
    nVarsMin = Abc_SuppSolve( vPairs, nVars );
    printf( "Solution with %d variables found.  ", nVarsMin );
    Abc_PrintTime( 1, "Covering time", Abc_Clock() - clk );

    Vec_WrdFreeP( &vPairs );
}